

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O1

int chacha_test_multiblock(chacha_key *key,chacha_iv *iv,uint8_t *in,uint8_t *out)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  uint8_t final [64];
  chacha_state st;
  uint local_e8 [16];
  chacha_state local_a8;
  
  lVar8 = 0;
  memset(out,0,0x800);
  local_a8.opaque._0_8_ = *(undefined8 *)key->b;
  local_a8.opaque._8_8_ = *(undefined8 *)(key->b + 8);
  local_a8.opaque._16_8_ = *(undefined8 *)(key->b + 0x10);
  local_a8.opaque._24_8_ = *(undefined8 *)(key->b + 0x18);
  local_a8.opaque._40_8_ = *(undefined8 *)iv->b;
  local_a8.opaque[0x30] = '\b';
  local_a8.opaque[0x31] = '\0';
  local_a8.opaque[0x32] = '\0';
  local_a8.opaque[0x33] = '\0';
  local_a8.opaque[0x34] = '\0';
  local_a8.opaque[0x35] = '\0';
  local_a8.opaque[0x36] = '\0';
  local_a8.opaque[0x37] = '\0';
  local_a8.opaque[0x38] = '\0';
  local_a8.opaque[0x39] = '\0';
  local_a8.opaque[0x3a] = '\0';
  local_a8.opaque[0x3b] = '\0';
  local_a8.opaque[0x3c] = '\0';
  local_a8.opaque[0x3d] = '\0';
  local_a8.opaque[0x3e] = '\0';
  local_a8.opaque[0x3f] = '\0';
  local_a8.opaque[0x20] = 0xff;
  local_a8.opaque[0x21] = 0xff;
  local_a8.opaque[0x22] = 0xff;
  local_a8.opaque[0x23] = 0xff;
  local_a8.opaque[0x24] = '\0';
  local_a8.opaque[0x25] = '\0';
  local_a8.opaque[0x26] = '\0';
  local_a8.opaque[0x27] = '\0';
  sVar6 = chacha_update(&local_a8,in,out,0x800);
  chacha_final(&local_a8,out + sVar6);
  local_e8[0] = 0;
  local_e8[1] = 0;
  local_e8[2] = 0;
  local_e8[3] = 0;
  local_e8[4] = 0;
  local_e8[5] = 0;
  local_e8[6] = 0;
  local_e8[7] = 0;
  local_e8[8] = 0;
  local_e8[9] = 0;
  local_e8[10] = 0;
  local_e8[0xb] = 0;
  local_e8[0xc] = 0;
  local_e8[0xd] = 0;
  local_e8[0xe] = 0;
  local_e8[0xf] = 0;
  do {
    lVar7 = 0;
    do {
      puVar1 = (uint *)(out + lVar7);
      uVar2 = puVar1[1];
      uVar3 = puVar1[2];
      uVar4 = puVar1[3];
      *(uint *)((long)local_e8 + lVar7) = *puVar1 ^ *(uint *)((long)local_e8 + lVar7);
      *(uint *)((long)local_e8 + lVar7 + 4) = uVar2 ^ *(uint *)((long)local_e8 + lVar7 + 4);
      *(uint *)((long)local_e8 + lVar7 + 8) = uVar3 ^ *(uint *)((long)local_e8 + lVar7 + 8);
      *(uint *)((long)local_e8 + lVar7 + 0xc) = uVar4 ^ *(uint *)((long)local_e8 + lVar7 + 0xc);
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x40);
    lVar8 = lVar8 + 1;
    out = out + 0x40;
  } while (lVar8 != 0x20);
  iVar5 = bcmp(expected_chacha,local_e8,0x40);
  return (int)(iVar5 == 0);
}

Assistant:

static int
chacha_test_multiblock(chacha_key *key, chacha_iv *iv, const uint8_t *in, uint8_t *out) {
    chacha_state st;
    uint8_t final[CHACHA_BLOCKBYTES];
    uint8_t *p = out;

    memset(out, 0, CHACHA_TEST_LEN);
    chacha_test_init_state(&st, key, iv);
    p += chacha_update(&st, in, p, CHACHA_TEST_LEN);
    chacha_final(&st, p);
    chacha_test_compact_array(final, out, CHACHA_TEST_LEN);
    return (memcmp(expected_chacha, final, sizeof(expected_chacha)) == 0) ? 1 : 0;
}